

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityHBMatrix.cpp
# Opt level: O2

void __thiscall OpenMD::TetrahedralityHBMatrix::initializeHistogram(TetrahedralityHBMatrix *this)

{
  pointer pvVar1;
  pointer puVar2;
  uint i;
  ulong uVar3;
  pointer puVar4;
  
  pvVar1 = (this->Q_histogram_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar3 = 0; uVar3 < (this->super_StaticAnalyser).nBins_; uVar3 = uVar3 + 1) {
    puVar2 = *(pointer *)
              ((long)&pvVar1[uVar3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data + 8);
    for (puVar4 = pvVar1[uVar3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void TetrahedralityHBMatrix::initializeHistogram() {
    for (unsigned int i = 0; i < nBins_; i++) {
      std::fill(Q_histogram_[i].begin(), Q_histogram_[i].end(), 0);
    }
  }